

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v2.cpp
# Opt level: O3

ssize_t __thiscall
LASreadItemCompressed_GPSTIME11_v2::read
          (LASreadItemCompressed_GPSTIME11_v2 *this,int __fd,void *__buf,size_t __nbytes)

{
  U64 UVar1;
  U32 UVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  I32 IVar7;
  undefined4 in_register_00000034;
  IntegerCompressor *pIVar8;
  
  if (this->last_gpstime_diff[this->last] == 0) {
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_0diff);
    if (UVar2 == 2) {
LAB_001280b4:
      this->next = this->next + 1 & 3;
      uVar4 = IntegerCompressor::decompress
                        (this->ic_gpstime,
                         *(I32 *)((long)this->last_gpstime + (ulong)this->last * 8 + 4),8);
      this->last_gpstime[this->next].u64 = (ulong)uVar4 << 0x20;
      UVar2 = ArithmeticDecoder::readInt(this->dec);
      uVar4 = this->next;
      this->last_gpstime[uVar4].u64 = this->last_gpstime[uVar4].u64 | (ulong)UVar2;
      this->last = uVar4;
      this->last_gpstime_diff[uVar4] = 0;
      this->multi_extreme_counter[uVar4] = 0;
      goto LAB_001281ef;
    }
    if (UVar2 != 1) {
      if ((int)UVar2 < 3) goto LAB_001281ef;
      this->last = UVar2 + this->last & 3 ^ 2;
LAB_00128141:
      (**(this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem)
                (this,(U64 *)CONCAT44(in_register_00000034,__fd),__buf);
      goto LAB_001281ef;
    }
    iVar3 = IntegerCompressor::decompress(this->ic_gpstime,0,0);
    uVar6 = (ulong)this->last;
    this->last_gpstime_diff[uVar6] = iVar3;
  }
  else {
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_multi);
    if (UVar2 != 1) {
      if (0x1fe < (int)UVar2) {
        if (UVar2 == 0x1ff) goto LAB_001281ef;
        if (UVar2 != 0x200) {
          this->last = this->last + UVar2 & 3;
          goto LAB_00128141;
        }
        goto LAB_001280b4;
      }
      if (UVar2 == 0) {
        pIVar8 = this->ic_gpstime;
        IVar7 = 0;
        UVar2 = 7;
LAB_0012819a:
        iVar5 = IntegerCompressor::decompress(pIVar8,IVar7,UVar2);
        uVar4 = this->last;
        iVar3 = this->multi_extreme_counter[uVar4];
        this->multi_extreme_counter[uVar4] = iVar3 + 1;
        if (2 < iVar3) {
          this->last_gpstime_diff[uVar4] = iVar5;
          this->multi_extreme_counter[uVar4] = 0;
        }
      }
      else {
        if (499 < (int)UVar2) {
          if (UVar2 == 0x1fe) {
            pIVar8 = this->ic_gpstime;
            IVar7 = this->last_gpstime_diff[this->last] * -10;
            UVar2 = 6;
          }
          else {
            if (UVar2 != 500) {
              pIVar8 = this->ic_gpstime;
              IVar7 = (500 - UVar2) * this->last_gpstime_diff[this->last];
              UVar2 = 5;
              goto LAB_001281df;
            }
            pIVar8 = this->ic_gpstime;
            IVar7 = this->last_gpstime_diff[this->last] * 500;
            UVar2 = 4;
          }
          goto LAB_0012819a;
        }
        IVar7 = this->last_gpstime_diff[this->last] * UVar2;
        pIVar8 = this->ic_gpstime;
        if ((int)UVar2 < 10) {
          UVar2 = 2;
        }
        else {
          UVar2 = 3;
        }
LAB_001281df:
        iVar5 = IntegerCompressor::decompress(pIVar8,IVar7,UVar2);
      }
      this->last_gpstime[this->last].u64 = this->last_gpstime[this->last].u64 + (long)iVar5;
      goto LAB_001281ef;
    }
    iVar3 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff[this->last],1);
    uVar6 = (ulong)this->last;
  }
  this->last_gpstime[uVar6].u64 = this->last_gpstime[uVar6].u64 + (long)iVar3;
  this->multi_extreme_counter[uVar6] = 0;
LAB_001281ef:
  UVar1 = this->last_gpstime[this->last].u64;
  *(U64 *)CONCAT44(in_register_00000034,__fd) = UVar1;
  return UVar1;
}

Assistant:

inline void LASreadItemCompressed_GPSTIME11_v2::read(U8* item, U32& context)
{
  I32 multi;
  if (last_gpstime_diff[last] == 0) // if the last integer difference was zero
  {
    multi = dec->decodeSymbol(m_gpstime_0diff);
    if (multi == 1) // the difference can be represented with 32 bits
    {
      last_gpstime_diff[last] = ic_gpstime->decompress(0, 0);
      last_gpstime[last].i64 += last_gpstime_diff[last];
      multi_extreme_counter[last] = 0; 
    }
    else if (multi == 2) // the difference is huge
    {
      next = (next+1)&3;
      last_gpstime[next].u64 = ic_gpstime->decompress((I32)(last_gpstime[last].u64 >> 32), 8);
      last_gpstime[next].u64 = last_gpstime[next].u64 << 32;
      last_gpstime[next].u64 |= dec->readInt();
      last = next;
      last_gpstime_diff[last] = 0;
      multi_extreme_counter[last] = 0; 
    }
    else if (multi > 2) // we switch to another sequence
    {
      last = (last+multi-2)&3;
      read(item, context);
    }
  }
  else
  {
    multi = dec->decodeSymbol(m_gpstime_multi);
    if (multi == 1)
    {
      last_gpstime[last].i64 += ic_gpstime->decompress(last_gpstime_diff[last], 1);;
      multi_extreme_counter[last] = 0;
    }
    else if (multi < LASZIP_GPSTIME_MULTI_UNCHANGED)
    {
      I32 gpstime_diff;
      if (multi == 0)
      {
        gpstime_diff = ic_gpstime->decompress(0, 7);
        multi_extreme_counter[last]++;
        if (multi_extreme_counter[last] > 3)
        {
          last_gpstime_diff[last] = gpstime_diff;
          multi_extreme_counter[last] = 0;
        }
      }
      else if (multi < LASZIP_GPSTIME_MULTI)
      {
        if (multi < 10)
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 2);
        else
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 3);
      }
      else if (multi == LASZIP_GPSTIME_MULTI)
      {
        gpstime_diff = ic_gpstime->decompress(LASZIP_GPSTIME_MULTI*last_gpstime_diff[last], 4);
        multi_extreme_counter[last]++;
        if (multi_extreme_counter[last] > 3)
        {
          last_gpstime_diff[last] = gpstime_diff;
          multi_extreme_counter[last] = 0;
        }
      }
      else
      {
        multi = LASZIP_GPSTIME_MULTI - multi;
        if (multi > LASZIP_GPSTIME_MULTI_MINUS)
        {
          gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff[last], 5);
        }
        else
        {
          gpstime_diff = ic_gpstime->decompress(LASZIP_GPSTIME_MULTI_MINUS*last_gpstime_diff[last], 6);
          multi_extreme_counter[last]++;
          if (multi_extreme_counter[last] > 3)
          {
            last_gpstime_diff[last] = gpstime_diff;
            multi_extreme_counter[last] = 0;
          }
        }
      }
      last_gpstime[last].i64 += gpstime_diff;
    }
    else if (multi ==  LASZIP_GPSTIME_MULTI_CODE_FULL)
    {
      next = (next+1)&3;
      last_gpstime[next].u64 = ic_gpstime->decompress((I32)(last_gpstime[last].u64 >> 32), 8);
      last_gpstime[next].u64 = last_gpstime[next].u64 << 32;
      last_gpstime[next].u64 |= dec->readInt();
      last = next;
      last_gpstime_diff[last] = 0;
      multi_extreme_counter[last] = 0; 
    }
    else if (multi >=  LASZIP_GPSTIME_MULTI_CODE_FULL)
    {
      last = (last+multi-LASZIP_GPSTIME_MULTI_CODE_FULL)&3;
      read(item, context);
    }
  }
  *((I64*)item) = last_gpstime[last].i64;
}